

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,double>,false>::
set_value_of_empty_bucket<std::pair<unsigned_long,double>>
          (bucket_entry<std::pair<unsigned_long,_double>,_false> *this,
          distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          pair<unsigned_long,_double> *value_type_args)

{
  undefined8 *in_RCX;
  truncated_hash_type in_EDX;
  undefined2 in_SI;
  bucket_entry_hash<false> *in_RDI;
  
  *(undefined8 *)(in_RDI + 8) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x10) = in_RCX[1];
  bucket_entry_hash<false>::set_hash(in_RDI,in_EDX);
  *(undefined2 *)in_RDI = in_SI;
  return;
}

Assistant:

void set_value_of_empty_bucket(distance_type dist_from_ideal_bucket,
                                 truncated_hash_type hash,
                                 Args&&... value_type_args) {
    tsl_rh_assert(dist_from_ideal_bucket >= 0);
    tsl_rh_assert(empty());

    ::new (static_cast<void*>(std::addressof(m_value)))
        value_type(std::forward<Args>(value_type_args)...);
    this->set_hash(hash);
    m_dist_from_ideal_bucket = dist_from_ideal_bucket;

    tsl_rh_assert(!empty());
  }